

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataModel.cpp
# Opt level: O0

DataVariable __thiscall Rml::DataModel::GetVariable(DataModel *this,DataAddress *address)

{
  bool bVar1;
  const_reference pvVar2;
  pointer ppVar3;
  size_type sVar4;
  DataVariable DVar5;
  bool local_81;
  VariableDefinition *local_70;
  VariableDefinition *local_68;
  int local_5c;
  undefined1 auStack_58 [4];
  int i;
  DataVariable variable;
  undefined1 local_38 [8];
  const_iterator it;
  DataAddress *address_local;
  DataModel *this_local;
  VariableDefinition *local_10;
  
  it.mInfo = (uint8_t *)address;
  bVar1 = ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::empty
                    (address);
  if (bVar1) {
    DataVariable::DataVariable((DataVariable *)&this_local);
  }
  else {
    pvVar2 = ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::front
                       ((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)
                        it.mInfo);
    _local_38 = robin_hood::detail::
                Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataVariable,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&this->variables,&pvVar2->name);
    join_0x00000010_0x00000000_ =
         robin_hood::detail::
         Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataVariable,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->variables);
    bVar1 = robin_hood::detail::
            Table<true,80ul,std::__cxx11::string,Rml::DataVariable,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
            ::Iter<true>::operator!=((Iter<true> *)local_38,(Iter<true> *)&variable.ptr);
    if (bVar1) {
      ppVar3 = robin_hood::detail::
               Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataVariable,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::Iter<true>::operator->((Iter<true> *)local_38);
      _auStack_58 = (ppVar3->second).definition;
      variable.definition = (VariableDefinition *)(ppVar3->second).ptr;
      local_5c = 1;
      while( true ) {
        sVar4 = ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::size
                          ((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)
                           it.mInfo);
        local_81 = false;
        if (local_5c < (int)sVar4) {
          local_81 = DataVariable::operator_cast_to_bool((DataVariable *)auStack_58);
        }
        if (local_81 == false) {
          local_10 = variable.definition;
          this_local = (DataModel *)_auStack_58;
          return _this_local;
        }
        pvVar2 = ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::
                 operator[]((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *
                            )it.mInfo,(long)local_5c);
        DVar5 = DataVariable::Child((DataVariable *)auStack_58,pvVar2);
        local_70 = DVar5.definition;
        _auStack_58 = local_70;
        local_68 = (VariableDefinition *)DVar5.ptr;
        variable.definition = local_68;
        bVar1 = DataVariable::operator_cast_to_bool((DataVariable *)auStack_58);
        if (!bVar1) break;
        local_5c = local_5c + 1;
      }
      DataVariable::DataVariable((DataVariable *)&this_local);
    }
    else {
      pvVar2 = ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::
               operator[]((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *)
                          it.mInfo,0);
      bVar1 = ::std::operator==(&pvVar2->name,"literal");
      if ((bVar1) &&
         (sVar4 = ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::size
                            ((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                              *)it.mInfo), 2 < sVar4)) {
        pvVar2 = ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::
                 operator[]((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_> *
                            )it.mInfo,1);
        bVar1 = ::std::operator==(&pvVar2->name,"int");
        if (bVar1) {
          pvVar2 = ::std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>::
                   operator[]((vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>
                               *)it.mInfo,2);
          DVar5 = MakeLiteralIntVariable(pvVar2->index);
          return DVar5;
        }
      }
      DataVariable::DataVariable((DataVariable *)&this_local);
    }
  }
  return _this_local;
}

Assistant:

DataVariable DataModel::GetVariable(const DataAddress& address) const
{
	if (address.empty())
		return DataVariable();

	auto it = variables.find(address.front().name);
	if (it != variables.end())
	{
		DataVariable variable = it->second;

		for (int i = 1; i < (int)address.size() && variable; i++)
		{
			variable = variable.Child(address[i]);
			if (!variable)
				return DataVariable();
		}

		return variable;
	}

	if (address[0].name == "literal")
	{
		if (address.size() > 2 && address[1].name == "int")
			return MakeLiteralIntVariable(address[2].index);
	}

	return DataVariable();
}